

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.hpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::DOMDocumentImpl::getPooledNString(DOMDocumentImpl *this,XMLCh *in,XMLSize_t n)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  DOMStringPoolEntry *pDVar5;
  XMLCh *pXVar6;
  DOMStringPoolEntry *pDVar4;
  
  if (in == (XMLCh *)0x0) {
    pXVar6 = (XMLCh *)0x0;
  }
  else {
    XVar3 = XMLString::hashN(in,n,this->fNameTableSize);
    pDVar4 = (DOMStringPoolEntry *)(this->fNameTable + XVar3);
    do {
      do {
        pDVar5 = pDVar4;
        pDVar4 = pDVar5->fNext;
        if (pDVar4 == (DOMStringPoolEntry *)0x0) {
          iVar2 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,n * 2 + 0x18);
          pDVar4 = (DOMStringPoolEntry *)CONCAT44(extraout_var,iVar2);
          pDVar5->fNext = pDVar4;
          pDVar4->fLength = n;
          pDVar4->fNext = (DOMStringPoolEntry *)0x0;
          XMLString::copyNString(pDVar4->fString,in,n);
          return pDVar4->fString;
        }
      } while (pDVar4->fLength != n);
      bVar1 = XMLString::equalsN(pDVar4->fString,in,n);
      pDVar4 = pDVar5->fNext;
    } while (!bVar1);
    pXVar6 = pDVar5->fNext->fString;
  }
  return pXVar6;
}

Assistant:

inline const XMLCh* DOMDocumentImpl::getPooledNString(const XMLCh *in, XMLSize_t n)
{
  if (in == 0)
    return 0;

  DOMStringPoolEntry    **pspe;
  DOMStringPoolEntry    *spe;

  XMLSize_t inHash = XMLString::hashN(in, n, fNameTableSize);
  pspe = &fNameTable[inHash];
  while (*pspe != 0)
  {
    if ((*pspe)->fLength == n && XMLString::equalsN((*pspe)->fString, in, n))
      return (*pspe)->fString;
    pspe = &((*pspe)->fNext);
  }

  // This string hasn't been seen before.  Add it to the pool.
  //

  // Compute size to allocate.  Note that there's 1 char of string
  // declared in the struct, so we don't need to add one again to
  // account for the trailing null.
  //
  XMLSize_t sizeToAllocate = sizeof(DOMStringPoolEntry) + n*sizeof(XMLCh);
  *pspe = spe = (DOMStringPoolEntry *)allocate(sizeToAllocate);
  spe->fLength = n;
  spe->fNext = 0;
  XMLString::copyNString((XMLCh*)spe->fString, in, n);

  return spe->fString;
}